

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::create_voxel2beamlet_list
          (EvaluationFunction *this,vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,
          Collimator *collimator)

{
  int iVar1;
  Matrix *this_00;
  reference pvVar2;
  value_type *__x;
  Collimator *in_RDX;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> *in_RSI;
  long in_RDI;
  Matrix *pMVar3;
  double dVar4;
  int b;
  int k;
  Matrix *D;
  int angle;
  int o;
  int i;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  Collimator *in_stack_ffffffffffffff50;
  list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_stack_ffffffffffffff60;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Collimator::getNbAngles(in_RDX);
    if (iVar1 <= local_1c) break;
    for (local_20 = 0; local_20 < *(int *)(in_RDI + 0x48); local_20 = local_20 + 1) {
      Collimator::getAngle(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::operator[](in_RSI,(long)local_20);
      this_00 = Volume::getDepositionMatrix
                          ((Volume *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      local_34 = 0;
      while( true ) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)local_20);
        if (*pvVar2 <= local_34) break;
        local_38 = 0;
        while( true ) {
          iVar1 = Collimator::getNangleBeamlets(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c)
          ;
          if (iVar1 <= local_38) break;
          dVar4 = maths::Matrix::operator()(this_00,local_34,local_38);
          if (0.0 < dVar4) {
            in_stack_ffffffffffffff50 = (Collimator *)(in_RDI + 0xe0);
            std::make_pair<int&,int&>
                      ((int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (int *)0x129d24);
            __x = (value_type *)
                  std::
                  unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                  ::operator[]((unordered_map<std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                                *)in_stack_ffffffffffffff50,
                               (key_type *)
                               CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            std::make_pair<int&,int&>
                      ((int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (int *)0x129d52);
            std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
            push_back(in_stack_ffffffffffffff60,__x);
            in_stack_ffffffffffffff60 =
                 (list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 (in_RDI + 0x118);
            std::make_pair<int&,int&>
                      ((int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (int *)0x129d8b);
            std::
            unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
            ::operator[]((unordered_map<std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>,_imrt::pair_hash,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>_>
                          *)in_stack_ffffffffffffff50,
                         (key_type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            pMVar3 = this_00;
            maths::Matrix::operator()(this_00,local_34,local_38);
            std::abs((int)pMVar3);
            std::make_pair<int&,int&>
                      ((int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (int *)0x129df6);
            std::make_pair<double,std::pair<int,int>>
                      ((double *)in_stack_ffffffffffffff50,
                       (pair<int,_int> *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            std::
            multimap<double,std::pair<int,int>,std::less<double>,std::allocator<std::pair<double_const,std::pair<int,int>>>>
            ::insert<std::pair<double,std::pair<int,int>>>
                      ((multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (pair<double,_std::pair<int,_int>_> *)0x129e24);
          }
          local_38 = local_38 + 1;
        }
        local_34 = local_34 + 1;
      }
    }
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void EvaluationFunction::create_voxel2beamlet_list(vector<Volume>& volumes, const Collimator& collimator){
	for (int i=0;i<collimator.getNbAngles();i++){
		for(int o=0; o<nb_organs; o++){
			 int angle = collimator.getAngle(i);
			 const Matrix&  D = volumes[o].getDepositionMatrix(angle);
			 for(int k=0; k<nb_voxels[o]; k++){
				 for(int b=0; b<collimator.getNangleBeamlets(angle); b++)
					 if(D(k,b) > 0.0) {
						 voxel2beamlet_list[make_pair(o,k)].push_back(make_pair(angle,b));
						 beamlet2voxel_list[make_pair(angle,b)].insert(make_pair(-abs(D(k,b)), make_pair(o,k)));
					 }
			 }
		}
	}
}